

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O2

void llama_kv_cache_view_update(llama_kv_cache_view *view,llama_kv_cache *kv)

{
  long lVar1;
  llama_kv_cache_view_cell *plVar2;
  llama_seq_id *plVar3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  int32_t i;
  ulong uVar9;
  int iVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  int32_t local_50;
  uint local_4c;
  
  if ((kv == (llama_kv_cache *)0x0) ||
     (lVar1 = __dynamic_cast(kv,&llama_kv_cache::typeinfo,&llama_kv_cache_unified::typeinfo,0),
     lVar1 == 0)) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: the kv_cache_view currently works only with llama_kv_cache_unified\n",
                       "llama_kv_cache_view_update");
    return;
  }
  uVar8 = *(uint *)(lVar1 + 0x6c);
  plVar2 = view->cells;
  if (uVar8 <= (uint)view->n_cells) {
    if (plVar2 != (llama_kv_cache_view_cell *)0x0) {
      plVar3 = view->cells_sequences;
      goto LAB_001f21fc;
    }
    plVar2 = (llama_kv_cache_view_cell *)0x0;
  }
  view->n_cells = uVar8;
  plVar2 = (llama_kv_cache_view_cell *)realloc(plVar2,(long)(int)uVar8 << 2);
  if (plVar2 == (llama_kv_cache_view_cell *)0x0) {
    pcVar7 = "p != nullptr && \"Failed to alloc kv_cache_view cells\"";
    uVar11 = 0x52a;
  }
  else {
    view->cells = plVar2;
    plVar3 = (llama_seq_id *)
             realloc(view->cells_sequences,(long)view->n_cells * (long)view->n_seq_max * 4);
    if (plVar3 != (llama_seq_id *)0x0) {
      view->cells_sequences = plVar3;
      plVar2 = view->cells;
LAB_001f21fc:
      iVar12 = 0;
      iVar10 = 0;
      local_50 = -1;
      uVar14 = 0xffffffff;
      local_4c = 0;
      for (uVar9 = 0; iVar13 = (int)uVar14, (long)uVar9 < (long)*(int *)(lVar1 + 0x6c);
          uVar9 = uVar9 + 1) {
        lVar5 = *(long *)(lVar1 + 0x78);
        lVar6 = uVar9 * 0x40;
        lVar15 = *(long *)(lVar5 + 0x38 + lVar6);
        plVar2->pos = *(int *)(lVar5 + 4 + lVar6) + *(int *)(lVar5 + lVar6);
        if (lVar15 == 0) {
          uVar14 = uVar14 & 0xffffffff;
          if (iVar13 < 0) {
            uVar14 = uVar9 & 0xffffffff;
          }
        }
        else {
          if ((-1 < iVar13) && (uVar8 = (int)uVar9 - iVar13, local_4c < uVar8)) {
            local_50 = iVar13;
            local_4c = uVar8;
          }
          uVar14 = 0xffffffffffffffff;
        }
        iVar10 = iVar10 + (int)lVar15;
        p_Var4 = *(_Rb_tree_node_base **)(lVar5 + lVar6 + 0x28);
        for (lVar15 = 0;
            (p_Var4 != (_Rb_tree_node_base *)(lVar5 + lVar6 + 0x18) && (lVar15 < view->n_seq_max));
            lVar15 = lVar15 + 1) {
          plVar3[lVar15] = p_Var4[1]._M_color;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        }
        bVar16 = lVar15 != 0;
        for (; lVar15 < view->n_seq_max; lVar15 = lVar15 + 1) {
          plVar3[lVar15] = -1;
        }
        iVar12 = iVar12 + (uint)bVar16;
        plVar2 = plVar2 + 1;
        plVar3 = plVar3 + view->n_seq_max;
      }
      if ((-1 < iVar13) &&
         (lVar5 = *(long *)(lVar1 + 0x80) - *(long *)(lVar1 + 0x78) >> 6,
         (ulong)local_4c < lVar5 - (uVar14 & 0xffffffff))) {
        local_4c = (int)lVar5 - iVar13;
        local_50 = iVar13;
      }
      view->max_contiguous = local_4c;
      view->max_contiguous_idx = local_50;
      view->token_count = iVar10;
      view->used_cells = iVar12;
      if (iVar12 == *(int *)(lVar1 + 0x70)) {
        return;
      }
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: used cells mismatch. kv_cache says %d but we calculated %d\n",
                         "llama_kv_cache_view_update");
      return;
    }
    pcVar7 = "p != nullptr && \"Failed to alloc kv_cache_view cells sequences\"";
    uVar11 = 0x52d;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
             ,uVar11,"GGML_ASSERT(%s) failed",pcVar7);
}

Assistant:

void llama_kv_cache_view_update(llama_kv_cache_view * view, const llama_kv_cache * kv) {
    // TODO: rework this in the future, for now quick hack
    const llama_kv_cache_unified * kvu = dynamic_cast<const llama_kv_cache_unified *>(kv);
    if (kvu == nullptr) {
        LLAMA_LOG_ERROR("%s: the kv_cache_view currently works only with llama_kv_cache_unified\n", __func__);
        return;
    }

    if (uint32_t(view->n_cells) < kvu->size || view->cells == nullptr) {
        view->n_cells = int32_t(kvu->size);
        void * p = realloc(view->cells, sizeof(llama_kv_cache_view_cell) * view->n_cells);
        GGML_ASSERT(p != nullptr && "Failed to alloc kv_cache_view cells");
        view->cells = (llama_kv_cache_view_cell *)p;
        p = realloc(view->cells_sequences, sizeof(llama_seq_id) * view->n_seq_max * view->n_cells);
        GGML_ASSERT(p != nullptr && "Failed to alloc kv_cache_view cells sequences");
        view->cells_sequences = (llama_seq_id *)p;
    }

    const std::vector<llama_kv_cell> & kv_cells = kvu->cells;
    llama_kv_cache_view_cell * c_curr = view->cells;
    llama_seq_id * cs_curr = view->cells_sequences;
    int32_t used_cells = 0;
    int32_t token_count = 0;
    int32_t curr_contig_idx = -1;
    uint32_t max_contig = 0;
    int32_t max_contig_idx = -1;

    for (int32_t i = 0; i < int32_t(kvu->size); i++, c_curr++, cs_curr += view->n_seq_max) {
        const size_t curr_size = kv_cells[i].seq_id.size();
        token_count += curr_size;
        c_curr->pos = kv_cells[i].pos + kv_cells[i].delta;

        if (curr_size > 0) {
            if (curr_contig_idx >= 0 && uint32_t(i - curr_contig_idx) > max_contig) {
                max_contig = i - curr_contig_idx;
                max_contig_idx = curr_contig_idx;
            }
            curr_contig_idx = -1;
        } else if (curr_contig_idx < 0) {
            curr_contig_idx = i;
        }

        int seq_idx = 0;
        for (const llama_seq_id it : kv_cells[i].seq_id) {
            if (seq_idx >= view->n_seq_max) {
                break;
            }
            cs_curr[seq_idx] = it;
            seq_idx++;
        }
        if (seq_idx != 0) {
            used_cells++;
        }
        for (; seq_idx < view->n_seq_max; seq_idx++) {
            cs_curr[seq_idx] = -1;
        }
    }
    if (curr_contig_idx >= 0 && kv_cells.size() - curr_contig_idx > max_contig) {
        max_contig_idx = curr_contig_idx;
        max_contig = kv_cells.size() - curr_contig_idx;
    }
    view->max_contiguous = max_contig;
    view->max_contiguous_idx = max_contig_idx;
    view->token_count = token_count;
    view->used_cells = used_cells;
    if (uint32_t(used_cells) != kvu->used) {
        LLAMA_LOG_ERROR("%s: used cells mismatch. kv_cache says %d but we calculated %d\n",
            __func__, kvu->used, used_cells);
    }
}